

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitUnary(OptimizeInstructions *this,Unary *curr)

{
  byte bVar1;
  UnaryOp UVar2;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
  matcher_00;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
  matcher_01;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_02;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_03;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_04;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_05;
  Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_06;
  bool bVar3;
  bool bVar4;
  Index IVar5;
  uint uVar6;
  BinaryOp BVar7;
  UnaryOp UVar8;
  BinaryOp BVar9;
  Module *pMVar10;
  int64_t v;
  PassRunner *pPVar11;
  Load *rep;
  Binary *pBVar12;
  Expression *pEVar13;
  Const *pCVar14;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *s;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  *pMVar15;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *s_00;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *pMVar16;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *s_01;
  Unary *pUVar17;
  OptimizeInstructions *binder;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *s1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R9;
  bool local_619;
  bool local_591;
  bool local_581;
  Expression *ret_3;
  Expression *ret_2;
  Expression *ret_1;
  Const *c_2;
  Binary *binary;
  Unary *unaryInner;
  Index bits;
  Expression *ext;
  BinaryOp op;
  Binary *inner_6;
  Load *load_1;
  Unary *inner_5;
  Type TStack_4d8;
  Index signExtBits;
  bool local_4c9;
  Load *pLStack_4c8;
  bool willBeSigned;
  Load *load;
  undefined1 local_4b8 [48];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_488;
  Expression *local_468;
  Unary *inner_4;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *pMStack_458;
  Index maxBits;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_448;
  Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_428;
  int local_3f4;
  undefined1 auStack_3f0 [4];
  UnaryOp unaryOp;
  Expression *x_2;
  Literal local_3e0;
  uintptr_t local_3c8;
  Builder local_3c0;
  Builder builder_1;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_3a8;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_388;
  undefined1 local_368 [8];
  Expression *x_1;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_350;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_330;
  undefined1 local_310 [8];
  Expression *x;
  Unary *inner_3;
  Expression *ret;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_2e8;
  uintptr_t local_2c8;
  Literal local_2c0;
  Literal local_2a8;
  Literal local_290;
  uintptr_t local_278;
  Literal local_270;
  uintptr_t local_258;
  byte local_249;
  Literal local_248;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_230;
  undefined1 local_1f0 [56];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
  local_1b8;
  long local_198;
  Binary *inner_2;
  Const *c_1;
  uintptr_t local_180;
  Literal local_168;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_150;
  undefined1 local_110 [56];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
  local_d8;
  Expression *local_b8;
  Binary *inner_1;
  Const *c;
  uintptr_t local_a0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_98;
  undefined1 local_88 [56];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_50;
  Expression *local_30;
  Binary *inner;
  Builder builder;
  Unary *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar3 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                      type,(BasicType *)((long)&builder.wasm + 4));
  if (!bVar3) {
    pMVar10 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
              getModule(&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       );
    Builder::Builder((Builder *)&inner,pMVar10);
    local_88._0_8_ = Match::any();
    local_98.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)Match::any()
    ;
    s = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
         *)local_88;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                *)(local_88 + 0x10),(Match *)&local_30,(Binary **)0x4,(Op)s,&local_98,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R9);
    Match::
    unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
              (&local_50,(Match *)0x13,(int)local_88 + Or,s);
    matcher.data = local_50.data;
    matcher._12_4_ = local_50._12_4_;
    matcher.binder = local_50.binder;
    matcher.submatchers.curr = local_50.submatchers.curr;
    matcher.submatchers._8_8_ = local_50.submatchers._8_8_;
    bVar3 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                      ((Expression *)curr,matcher);
    if (bVar3) {
      local_a0 = *(uintptr_t *)(local_30[1].type.id + 8);
      BVar7 = Abstract::getBinary((Type)local_a0,Eq);
      *(BinaryOp *)(local_30 + 1) = BVar7;
      wasm::Type::Type((Type *)&c,i32);
      (local_30->type).id = (uintptr_t)c;
      replaceCurrent(this,local_30);
    }
    else {
      local_110._0_8_ = Match::any();
      Match::ival(&local_150,(Const **)&inner_1);
      pMVar15 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                 *)local_110;
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                  *)(local_110 + 0x10),(Match *)&local_b8,(Binary **)0x3,(Op)pMVar15,
                 (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_150,in_R9);
      Match::
      unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                (&local_d8,(Match *)0x13,(int)local_110 + Or,pMVar15);
      matcher_00.data = local_d8.data;
      matcher_00._12_4_ = local_d8._12_4_;
      matcher_00.binder = local_d8.binder;
      matcher_00.submatchers.curr = local_d8.submatchers.curr;
      matcher_00.submatchers._8_8_ = local_d8.submatchers._8_8_;
      bVar3 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&>>
                        ((Expression *)curr,matcher_00);
      if (bVar3) {
        wasm::Literal::neg(&local_168,(Literal *)&inner_1->op);
        wasm::Literal::operator=((Literal *)&inner_1->op,&local_168);
        wasm::Literal::~Literal(&local_168);
        local_180 = (inner_1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                    type.id;
        BVar7 = Abstract::getBinary((Type)local_180,Eq);
        *(BinaryOp *)(local_b8 + 1) = BVar7;
        wasm::Type::Type((Type *)&c_1,i32);
        (local_b8->type).id = (uintptr_t)c_1;
        replaceCurrent(this,local_b8);
      }
      else {
        local_1f0._0_8_ = Match::any();
        Match::ival(&local_230,(Const **)&inner_2);
        pMVar15 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                   *)local_1f0;
        s1 = &local_230;
        Match::
        binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                  ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                    *)(local_1f0 + 0x10),(Match *)&local_198,(Binary **)0x9,(Op)pMVar15,
                   (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)s1,in_R9);
        Match::
        unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                  (&local_1b8,(Match *)0x13,(int)local_1f0 + Or,pMVar15);
        matcher_01.data = local_1b8.data;
        matcher_01._12_4_ = local_1b8._12_4_;
        matcher_01.binder = local_1b8.binder;
        matcher_01.submatchers.curr = local_1b8.submatchers.curr;
        matcher_01.submatchers._8_8_ = local_1b8.submatchers._8_8_;
        bVar3 = Match::
                matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&>>
                          ((Expression *)curr,matcher_01);
        s_00 = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
               CONCAT71((int7)((ulong)local_1b8.submatchers.curr >> 8),bVar3);
        local_249 = 0;
        local_581 = false;
        if (bVar3) {
          bVar3 = wasm::Literal::isSignedMin((Literal *)&inner_2->op);
          s_00 = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                 CONCAT71((int7)((ulong)s_00 >> 8),bVar3);
          local_591 = true;
          if (!bVar3) {
            wasm::Literal::abs(&local_248,(int)inner_2 + 0x10);
            local_249 = 1;
            v = wasm::Literal::getInteger(&local_248);
            local_591 = Bits::isPowerOf2<long>(v);
          }
          local_581 = local_591;
        }
        if ((local_249 & 1) != 0) {
          wasm::Literal::~Literal(&local_248);
        }
        if (local_581 == false) {
          ret = (Expression *)Match::any();
          pUVar17 = (Unary *)0x18;
          Match::
          unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                    (&local_2e8,(Match *)0x18,(UnaryOp)&ret,s_00);
          matcher_02.data = local_2e8.data;
          matcher_02._12_4_ = local_2e8._12_4_;
          matcher_02.binder = local_2e8.binder;
          matcher_02.submatchers.curr = local_2e8.submatchers.curr;
          matcher_02.submatchers._8_8_ = local_2e8.submatchers._8_8_;
          bVar3 = Match::
                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                            ((Expression *)curr,matcher_02);
          if (bVar3) {
            pUVar17 = curr;
            inner_3 = (Unary *)optimizeWrappedResult(this,curr);
            if (inner_3 != (Unary *)0x0) {
              replaceCurrent(this,(Expression *)inner_3);
              return;
            }
            inner_3 = (Unary *)0x0;
          }
          x_1 = (Expression *)
                Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_310
                           ,(Expression **)pUVar17);
          pMVar16 = (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)&x_1;
          Match::
          unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                    (&local_350,(Match *)&x,(Unary **)0x18,(UnaryOp)pMVar16,
                     (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)s1);
          binder = (OptimizeInstructions *)0x14;
          Match::
          unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                    (&local_330,(Match *)0x14,(UnaryOp)&local_350,pMVar16);
          matcher_03.data = local_330.data;
          matcher_03._12_4_ = local_330._12_4_;
          matcher_03.binder = local_330.binder;
          matcher_03.submatchers.curr = local_330.submatchers.curr;
          matcher_03.submatchers._8_8_ = local_330.submatchers._8_8_;
          bVar4 = Match::
                  matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                            ((Expression *)curr,matcher_03);
          s_01 = (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                  *)CONCAT71((int7)((ulong)local_330.submatchers.curr >> 8),bVar4);
          bVar3 = false;
          if (bVar4) {
            binder = this;
            IVar5 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)local_310,this);
            bVar3 = IVar5 < 0x21;
          }
          if (bVar3) {
            *(undefined4 *)(x + 1) = 0x15;
            replaceCurrent(this,x);
          }
          else {
            pPVar11 = Pass::getPassRunner((Pass *)this);
            if ((pPVar11->options).shrinkLevel == 0) {
              builder_1.wasm =
                   (Module *)
                   Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                              local_368,(Expression **)binder);
              Match::
              unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                        (&local_3a8,(Match *)0x13,(Op)&builder_1,
                         (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)s_01);
              binder = (OptimizeInstructions *)0x14;
              Match::
              unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                        (&local_388,(Match *)0x14,(UnaryOp)&local_3a8,s_01);
              matcher_04.data = local_388.data;
              matcher_04._12_4_ = local_388._12_4_;
              matcher_04.binder = local_388.binder;
              matcher_04.submatchers.curr = local_388.submatchers.curr;
              matcher_04.submatchers._8_8_ = local_388.submatchers._8_8_;
              bVar3 = Match::
                      matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                                ((Expression *)curr,matcher_04);
              s_01 = local_388.submatchers.curr;
              if (bVar3) {
                pMVar10 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          ::getModule(&(this->
                                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                       ).
                                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                       .
                                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                     );
                Builder::Builder(&local_3c0,pMVar10);
                local_3c8 = ((Type *)((long)local_368 + 8))->id;
                BVar7 = Abstract::getBinary((Type)local_3c8,Ne);
                x_2 = (Expression *)((Type *)((long)local_368 + 8))->id;
                wasm::Literal::makeZero(&local_3e0,(Type)x_2);
                pCVar14 = Builder::makeConst(&local_3c0,&local_3e0);
                pBVar12 = Builder::makeBinary(&local_3c0,BVar7,(Expression *)local_368,
                                              (Expression *)pCVar14);
                replaceCurrent(this,(Expression *)pBVar12);
                wasm::Literal::~Literal(&local_3e0);
                return;
              }
            }
            pMStack_458 = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *
                                     )auStack_3f0,(Expression **)binder);
            Match::
            unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                      (&local_448,(Match *)0x18,(UnaryOp)&stack0xfffffffffffffba8,
                       (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)s_01);
            Match::
            unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                      (&local_428,(Match *)&local_3f4,(UnaryOp *)&local_448,
                       (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                        *)s_01);
            matcher_06._8_8_ = local_428._8_8_;
            matcher_06.binder = local_428.binder;
            matcher_06.submatchers.curr.binder = local_428.submatchers.curr.binder;
            matcher_06.submatchers.curr._8_8_ = local_428.submatchers.curr._8_8_;
            matcher_06.submatchers.next.curr = local_428.submatchers.next.curr;
            matcher_06.submatchers.next._8_8_ = local_428.submatchers.next._8_8_;
            bVar3 = Match::
                    matches<wasm::Match::Internal::Matcher<wasm::Unary*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                              ((Expression *)curr,matcher_06);
            if (((bVar3) && ((local_3f4 == 0x16 || (local_3f4 == 0x17)))) &&
               (((inner_4._4_4_ = Bits::getMaxBits<wasm::OptimizeInstructions>(_auStack_3f0,this),
                 local_3f4 == 0x16 && (inner_4._4_4_ < 0x20)) ||
                ((local_3f4 == 0x17 && (inner_4._4_4_ < 0x21)))))) {
              replaceCurrent(this,_auStack_3f0);
            }
            else {
              pMVar10 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        ::getModule(&(this->
                                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                     ).
                                     super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                     .
                                     super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   );
              bVar3 = FeatureSet::hasSignExt(&pMVar10->features);
              if (bVar3) {
                local_4b8._0_8_ = Match::any();
                pMVar16 = (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                           *)local_4b8;
                Match::
                unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                          ((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                            *)(local_4b8 + 0x10),(Match *)&local_468,(Unary **)0x18,(UnaryOp)pMVar16
                           ,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)s1);
                Match::
                unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                          (&local_488,(Match *)0x16,(int)local_4b8 + NearestFloat32,pMVar16);
                matcher_05.data = local_488.data;
                matcher_05._12_4_ = local_488._12_4_;
                matcher_05.binder = local_488.binder;
                matcher_05.submatchers.curr = local_488.submatchers.curr;
                matcher_05.submatchers._8_8_ = local_488.submatchers._8_8_;
                bVar3 = Match::
                        matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                                  ((Expression *)curr,matcher_05);
                if (bVar3) {
                  *(undefined4 *)(local_468 + 1) = 0x33;
                  wasm::Type::Type((Type *)&load,i64);
                  (local_468->type).id = (uintptr_t)load;
                  replaceCurrent(this,local_468);
                  return;
                }
              }
              if (((curr->op == ExtendUInt32) || (curr->op == ExtendSInt32)) &&
                 (pLStack_4c8 = Expression::dynCast<wasm::Load>(curr->value),
                 pLStack_4c8 != (Load *)0x0)) {
                local_619 = false;
                if (curr->op == ExtendSInt32) {
                  local_619 = pLStack_4c8->bytes == '\x04';
                }
                local_4c9 = local_619;
                if ((((curr->op != ExtendUInt32) || (2 < pLStack_4c8->bytes)) ||
                    ((pLStack_4c8->signed_ & 1U) == 0)) &&
                   ((local_619 == false || ((pLStack_4c8->isAtomic & 1U) == 0)))) {
                  if (local_619 != false) {
                    pLStack_4c8->signed_ = true;
                  }
                  wasm::Type::Type(&stack0xfffffffffffffb28,i64);
                  (pLStack_4c8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression
                  .type.id = TStack_4d8.id;
                  replaceCurrent(this,(Expression *)pLStack_4c8);
                  return;
                }
              }
              IVar5 = getSignExtBits(this,curr->value);
              if ((IVar5 == 0) ||
                 ((((curr->op != ExtendS8Int32 || (8 < IVar5)) &&
                   (((curr->op != ExtendS16Int32 || (0x10 < IVar5)) &&
                    ((curr->op != ExtendS8Int64 || (8 < IVar5)))))) &&
                  (((curr->op != ExtendS16Int64 || (0x10 < IVar5)) &&
                   ((curr->op != ExtendS32Int64 || (0x20 < IVar5)))))))) {
                bVar3 = Abstract::hasAnyReinterpret(curr->op);
                if (bVar3) {
                  pUVar17 = Expression::dynCast<wasm::Unary>(curr->value);
                  if (((pUVar17 != (Unary *)0x0) &&
                      (bVar3 = Abstract::hasAnyReinterpret(pUVar17->op), bVar3)) &&
                     (bVar3 = wasm::Type::operator==
                                        (&pUVar17->value->type,
                                         &(curr->super_SpecificExpression<(wasm::Expression::Id)15>)
                                          .super_Expression.type), bVar3)) {
                    replaceCurrent(this,pUVar17->value);
                    return;
                  }
                  rep = Expression::dynCast<wasm::Load>(curr->value);
                  if (((rep != (Load *)0x0) && ((rep->isAtomic & 1U) == 0)) &&
                     (bVar1 = rep->bytes,
                     uVar6 = wasm::Type::getByteSize
                                       (&(curr->super_SpecificExpression<(wasm::Expression::Id)15>).
                                         super_Expression.type), bVar1 == uVar6)) {
                    (rep->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.
                    id = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression
                         .type.id;
                    replaceCurrent(this,(Expression *)rep);
                    return;
                  }
                }
                if (curr->op == EqZInt32) {
                  pBVar12 = Expression::dynCast<wasm::Binary>(curr->value);
                  if ((pBVar12 != (Binary *)0x0) &&
                     (BVar7 = invertBinaryOp(this,pBVar12->op), BVar7 != InvalidBinary)) {
                    pBVar12->op = BVar7;
                    replaceCurrent(this,(Expression *)pBVar12);
                    return;
                  }
                  pEVar13 = Properties::getSignExtValue(curr->value);
                  if (pEVar13 != (Expression *)0x0) {
                    IVar5 = Properties::getSignExtBits(curr->value);
                    pEVar13 = makeZeroExt(this,pEVar13,IVar5);
                    curr->value = pEVar13;
                    replaceCurrent(this,(Expression *)curr);
                    return;
                  }
                }
                else if ((curr->op == AbsFloat32) || (curr->op == AbsFloat64)) {
                  pUVar17 = Expression::dynCast<wasm::Unary>(curr->value);
                  if ((pUVar17 != (Unary *)0x0) &&
                     (UVar2 = pUVar17->op,
                     UVar8 = Abstract::getUnary((Type)(pUVar17->
                                                                                                            
                                                  super_SpecificExpression<(wasm::Expression::Id)15>
                                                  ).super_Expression.type.id,Neg), UVar2 == UVar8))
                  {
                    curr->value = pUVar17->value;
                    replaceCurrent(this,(Expression *)curr);
                    return;
                  }
                  pBVar12 = Expression::dynCast<wasm::Binary>(curr->value);
                  if (pBVar12 != (Binary *)0x0) {
                    BVar7 = pBVar12->op;
                    BVar9 = Abstract::getBinary((Type)(pBVar12->
                                                                                                            
                                                  super_SpecificExpression<(wasm::Expression::Id)16>
                                                  ).super_Expression.type.id,Mul);
                    if (((BVar7 == BVar9) ||
                        (BVar7 = pBVar12->op,
                        BVar9 = Abstract::getBinary((Type)(pBVar12->
                                                                                                                    
                                                  super_SpecificExpression<(wasm::Expression::Id)16>
                                                  ).super_Expression.type.id,DivS), BVar7 == BVar9))
                       && (bVar3 = areConsecutiveInputsEqual(this,pBVar12->left,pBVar12->right),
                          bVar3)) {
                      replaceCurrent(this,(Expression *)pBVar12);
                      return;
                    }
                    if ((((this->fastMath & 1U) != 0) &&
                        (BVar7 = pBVar12->op,
                        BVar9 = Abstract::getBinary((Type)(pBVar12->
                                                                                                                    
                                                  super_SpecificExpression<(wasm::Expression::Id)16>
                                                  ).super_Expression.type.id,Sub), BVar7 == BVar9))
                       && ((pCVar14 = Expression::dynCast<wasm::Const>(pBVar12->left),
                           pCVar14 != (Const *)0x0 &&
                           (bVar3 = wasm::Literal::isZero(&pCVar14->value), bVar3)))) {
                      curr->value = pBVar12->right;
                      replaceCurrent(this,(Expression *)curr);
                      return;
                    }
                  }
                }
                pEVar13 = deduplicateUnary(this,curr);
                if (pEVar13 == (Expression *)0x0) {
                  pEVar13 = simplifyRoundingsAndConversions(this,curr);
                  if (pEVar13 == (Expression *)0x0) {
                    pEVar13 = replaceZeroBitsWithZero(this,(Expression *)curr);
                    if (pEVar13 != (Expression *)0x0) {
                      replaceCurrent(this,pEVar13);
                    }
                  }
                  else {
                    replaceCurrent(this,pEVar13);
                  }
                }
                else {
                  replaceCurrent(this,pEVar13);
                }
              }
              else {
                replaceCurrent(this,curr->value);
              }
            }
          }
        }
        else {
          local_258 = (inner_2->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression
                      .type.id;
          BVar7 = Abstract::getBinary((Type)local_258,And);
          *(BinaryOp *)(local_198 + 0x10) = BVar7;
          bVar3 = wasm::Literal::isSignedMin((Literal *)&inner_2->op);
          if (bVar3) {
            local_278 = (inner_2->super_SpecificExpression<(wasm::Expression::Id)16>).
                        super_Expression.type.id;
            wasm::Literal::makeSignedMax(&local_270,(Type)local_278);
            wasm::Literal::operator=((Literal *)&inner_2->op,&local_270);
            wasm::Literal::~Literal(&local_270);
          }
          else {
            wasm::Literal::abs(&local_2a8,(int)inner_2 + 0x10);
            local_2c8 = (inner_2->super_SpecificExpression<(wasm::Expression::Id)16>).
                        super_Expression.type.id;
            wasm::Literal::makeOne(&local_2c0,(Type)local_2c8);
            wasm::Literal::sub(&local_290,&local_2a8,&local_2c0);
            wasm::Literal::operator=((Literal *)&inner_2->op,&local_290);
            wasm::Literal::~Literal(&local_290);
            wasm::Literal::~Literal(&local_2c0);
            wasm::Literal::~Literal(&local_2a8);
          }
          replaceCurrent(this,(Expression *)curr);
        }
      }
    }
  }
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    {
      using namespace Match;
      using namespace Abstract;
      Builder builder(*getModule());
      {
        // eqz(x - y)  =>  x == y
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Sub, any(), any())))) {
          inner->op = Abstract::getBinary(inner->left->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz(x + C)  =>  x == -C
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, Add, any(), ival(&c))))) {
          c->value = c->value.neg();
          inner->op = Abstract::getBinary(c->type, Eq);
          inner->type = Type::i32;
          return replaceCurrent(inner);
        }
      }
      {
        // eqz((signed)x % C_pot)  =>  eqz(x & (abs(C_pot) - 1))
        Const* c;
        Binary* inner;
        if (matches(curr, unary(EqZ, binary(&inner, RemS, any(), ival(&c)))) &&
            (c->value.isSignedMin() ||
             Bits::isPowerOf2(c->value.abs().getInteger()))) {
          inner->op = Abstract::getBinary(c->type, And);
          if (c->value.isSignedMin()) {
            c->value = Literal::makeSignedMax(c->type);
          } else {
            c->value = c->value.abs().sub(Literal::makeOne(c->type));
          }
          return replaceCurrent(curr);
        }
      }
      {
        // i32.wrap_i64 can be removed if the operations inside it do not
        // actually require 64 bits, e.g.:
        //
        // i32.wrap_i64(i64.extend_i32_u(x))  =>  x
        if (matches(curr, unary(WrapInt64, any()))) {
          if (auto* ret = optimizeWrappedResult(curr)) {
            return replaceCurrent(ret);
          }
        }
      }
      {
        // i32.eqz(i32.wrap_i64(x))  =>  i64.eqz(x)
        //   where maxBits(x) <= 32
        Unary* inner;
        Expression* x;
        if (matches(curr, unary(EqZInt32, unary(&inner, WrapInt64, any(&x)))) &&
            Bits::getMaxBits(x, this) <= 32) {
          inner->op = EqZInt64;
          return replaceCurrent(inner);
        }
      }
      {
        // i32.eqz(i32.eqz(x))  =>  i32(x) != 0
        // i32.eqz(i64.eqz(x))  =>  i64(x) != 0
        //   iff shinkLevel == 0
        // (1 instruction instead of 2, but 1 more byte)
        if (getPassRunner()->options.shrinkLevel == 0) {
          Expression* x;
          if (matches(curr, unary(EqZInt32, unary(EqZ, any(&x))))) {
            Builder builder(*getModule());
            return replaceCurrent(builder.makeBinary(
              getBinary(x->type, Ne),
              x,
              builder.makeConst(Literal::makeZero(x->type))));
          }
        }
      }
      {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 31
        //
        // i64.extend_i32_u(i32.wrap_i64(x))  =>  x
        //   where maxBits(x) <= 32
        Expression* x;
        UnaryOp unaryOp;
        if (matches(curr, unary(&unaryOp, unary(WrapInt64, any(&x))))) {
          if (unaryOp == ExtendSInt32 || unaryOp == ExtendUInt32) {
            auto maxBits = Bits::getMaxBits(x, this);
            if ((unaryOp == ExtendSInt32 && maxBits <= 31) ||
                (unaryOp == ExtendUInt32 && maxBits <= 32)) {
              return replaceCurrent(x);
            }
          }
        }
      }
      if (getModule()->features.hasSignExt()) {
        // i64.extend_i32_s(i32.wrap_i64(x))  =>  i64.extend32_s(x)
        Unary* inner;
        if (matches(curr,
                    unary(ExtendSInt32, unary(&inner, WrapInt64, any())))) {
          inner->op = ExtendS32Int64;
          inner->type = Type::i64;
          return replaceCurrent(inner);
        }
      }
    }

    if (curr->op == ExtendUInt32 || curr->op == ExtendSInt32) {
      if (auto* load = curr->value->dynCast<Load>()) {
        // i64.extend_i32_s(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // i64.extend_i32_u(i32.load(_8|_16)(_u|_s)(x))  =>
        //    i64.load(_8|_16|_32)(_u|_s)(x)
        //
        // but we can't do this in following cases:
        //
        //    i64.extend_i32_u(i32.load8_s(x))
        //    i64.extend_i32_u(i32.load16_s(x))
        //
        // this mixed sign/zero extensions can't represent in single
        // signed or unsigned 64-bit load operation. For example if `load8_s(x)`
        // return i8(-1) (0xFF) than sign extended result will be
        // i32(-1) (0xFFFFFFFF) and with zero extension to i64 we got
        // finally 0x00000000FFFFFFFF. However with `i64.load8_s` in this
        // situation we got `i64(-1)` (all ones) and with `i64.load8_u` it
        // will be 0x00000000000000FF.
        //
        // Another limitation is atomics which only have unsigned loads.
        // So we also avoid this only case:
        //
        //   i64.extend_i32_s(i32.atomic.load(x))

        // Special case for i32.load. In this case signedness depends on
        // extend operation.
        bool willBeSigned = curr->op == ExtendSInt32 && load->bytes == 4;
        if (!(curr->op == ExtendUInt32 && load->bytes <= 2 && load->signed_) &&
            !(willBeSigned && load->isAtomic)) {
          if (willBeSigned) {
            load->signed_ = true;
          }
          load->type = Type::i64;
          return replaceCurrent(load);
        }
      }
    }

    // Simple sign extends can be removed if the value is already sign-extended.
    auto signExtBits = getSignExtBits(curr->value);
    if (signExtBits > 0) {
      // Note that we can handle the case of |curr| having a larger sign-extend:
      // if we have an 8-bit value in 32-bit, then there are 24 sign bits, and
      // doing a sign-extend to 16 will only affect 16 of those 24, and the
      // effect is to leave them as they are.
      if ((curr->op == ExtendS8Int32 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int32 && signExtBits <= 16) ||
          (curr->op == ExtendS8Int64 && signExtBits <= 8) ||
          (curr->op == ExtendS16Int64 && signExtBits <= 16) ||
          (curr->op == ExtendS32Int64 && signExtBits <= 32)) {
        return replaceCurrent(curr->value);
      }
    }

    if (Abstract::hasAnyReinterpret(curr->op)) {
      // i32.reinterpret_f32(f32.reinterpret_i32(x))  =>  x
      // i64.reinterpret_f64(f64.reinterpret_i64(x))  =>  x
      // f32.reinterpret_i32(i32.reinterpret_f32(x))  =>  x
      // f64.reinterpret_i64(i64.reinterpret_f64(x))  =>  x
      if (auto* inner = curr->value->dynCast<Unary>()) {
        if (Abstract::hasAnyReinterpret(inner->op)) {
          if (inner->value->type == curr->type) {
            return replaceCurrent(inner->value);
          }
        }
      }
      // f32.reinterpret_i32(i32.load(x))  =>  f32.load(x)
      // f64.reinterpret_i64(i64.load(x))  =>  f64.load(x)
      // i32.reinterpret_f32(f32.load(x))  =>  i32.load(x)
      // i64.reinterpret_f64(f64.load(x))  =>  i64.load(x)
      if (auto* load = curr->value->dynCast<Load>()) {
        if (!load->isAtomic && load->bytes == curr->type.getByteSize()) {
          load->type = curr->type;
          return replaceCurrent(load);
        }
      }
    }

    if (curr->op == EqZInt32) {
      if (auto* inner = curr->value->dynCast<Binary>()) {
        // Try to invert a relational operation using De Morgan's law
        auto op = invertBinaryOp(inner->op);
        if (op != InvalidBinary) {
          inner->op = op;
          return replaceCurrent(inner);
        }
      }
      // eqz of a sign extension can be of zero-extension
      if (auto* ext = Properties::getSignExtValue(curr->value)) {
        // we are comparing a sign extend to a constant, which means we can
        // use a cheaper zext
        auto bits = Properties::getSignExtBits(curr->value);
        curr->value = makeZeroExt(ext, bits);
        return replaceCurrent(curr);
      }
    } else if (curr->op == AbsFloat32 || curr->op == AbsFloat64) {
      // abs(-x)   ==>   abs(x)
      if (auto* unaryInner = curr->value->dynCast<Unary>()) {
        if (unaryInner->op ==
            Abstract::getUnary(unaryInner->type, Abstract::Neg)) {
          curr->value = unaryInner->value;
          return replaceCurrent(curr);
        }
      }
      // abs(x * x)   ==>   x * x
      // abs(x / x)   ==>   x / x
      if (auto* binary = curr->value->dynCast<Binary>()) {
        if ((binary->op == Abstract::getBinary(binary->type, Abstract::Mul) ||
             binary->op == Abstract::getBinary(binary->type, Abstract::DivS)) &&
            areConsecutiveInputsEqual(binary->left, binary->right)) {
          return replaceCurrent(binary);
        }
        // abs(0 - x)   ==>   abs(x),
        // only for fast math
        if (fastMath &&
            binary->op == Abstract::getBinary(binary->type, Abstract::Sub)) {
          if (auto* c = binary->left->dynCast<Const>()) {
            if (c->value.isZero()) {
              curr->value = binary->right;
              return replaceCurrent(curr);
            }
          }
        }
      }
    }

    if (auto* ret = deduplicateUnary(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = simplifyRoundingsAndConversions(curr)) {
      return replaceCurrent(ret);
    }

    if (auto* ret = replaceZeroBitsWithZero(curr)) {
      return replaceCurrent(ret);
    }
  }